

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v6::vprint(FILE *f,string_view format_str,format_args args)

{
  basic_string_view<char> format_str_00;
  undefined **local_290;
  undefined1 *local_288;
  size_t sStack_280;
  undefined8 local_278;
  undefined1 local_270 [504];
  undefined1 local_78 [8];
  detail *local_70;
  char *local_68;
  undefined4 local_60;
  undefined ***local_58;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *local_50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_2
  local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_28;
  
  local_48 = args.
             super_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             .field_1;
  local_50 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
              *)args.
                super_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                .desc_;
  local_68 = (char *)format_str.size_;
  local_70 = (detail *)format_str.data_;
  sStack_280 = 0;
  local_290 = &PTR_grow_00116a58;
  local_278 = 500;
  local_60 = 0;
  local_58 = &local_290;
  local_40 = 0;
  local_38 = 0;
  local_28 = 0;
  format_str_00.size_ = (size_t)local_78;
  format_str_00.data_ = local_68;
  local_288 = local_270;
  detail::
  parse_format_string<false,char,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&>
            (local_70,format_str_00,local_50);
  detail::fwrite_fully(local_288,1,sStack_280,f);
  local_290 = &PTR_grow_00116a58;
  if (local_288 != local_270) {
    operator_delete(local_288);
  }
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str,
                     basic_format_args<buffer_context<char>>(args));
#ifdef _WIN32
  auto fd = _fileno(f);
  if (_isatty(fd)) {
    detail::utf8_to_utf16 u16(string_view(buffer.data(), buffer.size()));
    auto written = DWORD();
    if (!WriteConsoleW(reinterpret_cast<HANDLE>(_get_osfhandle(fd)),
                       u16.c_str(), static_cast<DWORD>(u16.size()), &written,
                       nullptr)) {
      FMT_THROW(format_error("failed to write to console"));
    }
    return;
  }
#endif
  detail::fwrite_fully(buffer.data(), 1, buffer.size(), f);
}